

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gls::BufferTestUtil::VertexArrayVerifier::~VertexArrayVerifier(VertexArrayVerifier *this)

{
  ShaderProgram *this_00;
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  (this->super_BufferVerifierBase)._vptr_BufferVerifierBase =
       (_func_int **)&PTR__VertexArrayVerifier_00c42ab8;
  iVar1 = (*((this->super_BufferVerifierBase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_vao != 0) {
    (**(code **)(lVar2 + 0x490))(1,&this->m_vao);
  }
  if (this->m_positionBuf != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_positionBuf);
  }
  if (this->m_indexBuf != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_indexBuf);
  }
  this_00 = this->m_program;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
  }
  operator_delete(this_00,0xd0);
  glu::CallLogWrapper::~CallLogWrapper(&(this->super_BufferVerifierBase).super_CallLogWrapper);
  return;
}

Assistant:

VertexArrayVerifier::~VertexArrayVerifier (void)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	if (m_vao)			gl.deleteVertexArrays(1, &m_vao);
	if (m_positionBuf)	gl.deleteBuffers(1, &m_positionBuf);
	if (m_indexBuf)		gl.deleteBuffers(1, &m_indexBuf);

	delete m_program;
}